

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::do_all_post_load_init(CVmObjTable *this)

{
  pli_enum_ctx ctx;
  _func_void_void_ptr_CVmHashEntry_ptr *in_stack_00000018;
  CVmHashTable *in_stack_00000020;
  
  CVmHashTable::enum_entries(in_stack_00000020,in_stack_00000018,this);
  CVmHashTable::enum_entries(in_stack_00000020,in_stack_00000018,this);
  return;
}

Assistant:

void CVmObjTable::do_all_post_load_init(VMG0_)
{
    pli_enum_ctx ctx;

    /* set up our context */
    ctx.globals = VMGLOB_ADDR;

    /* first, mark all entries as having status 'uninitialized' */
    post_load_init_table_->enum_entries(&pli_status_cb, &ctx);

    /* next, invoke the initializer method for each entry */
    post_load_init_table_->enum_entries(&pli_invoke_cb, &ctx);
}